

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
AdapterPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::Canceler::AdapterImpl<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>_>
::reject(AdapterPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::Canceler::AdapterImpl<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>_>
         *this,Exception *exception)

{
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> local_1a8;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_1a8.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_1a8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         (exception->ownFile).content.ptr;
    local_1a8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         (exception->ownFile).content.size_;
    local_1a8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         (exception->ownFile).content.disposer;
    (exception->ownFile).content.ptr = (char *)0x0;
    (exception->ownFile).content.size_ = 0;
    local_1a8.super_ExceptionOrValue.exception.ptr.field_1.value.file = exception->file;
    local_1a8.super_ExceptionOrValue.exception.ptr.field_1._32_4_ = exception->line;
    local_1a8.super_ExceptionOrValue.exception.ptr.field_1._36_4_ = exception->type;
    local_1a8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (exception->description).content.ptr;
    local_1a8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         (exception->description).content.size_;
    (exception->description).content.ptr = (char *)0x0;
    (exception->description).content.size_ = 0;
    local_1a8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         (exception->description).content.disposer;
    local_1a8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         (exception->context).ptr.disposer;
    local_1a8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         (exception->context).ptr.ptr;
    (exception->context).ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_1a8.super_ExceptionOrValue.exception.ptr.field_1 + 0x50),
           exception->trace,0x104);
    local_1a8.value.ptr.isSet = false;
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::operator=
              (&this->result,&local_1a8);
    if (local_1a8.value.ptr.isSet == true) {
      OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::destroy
                (&local_1a8.value.ptr.field_1.value);
    }
    if (local_1a8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1a8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }